

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_parse_supported_point_formats(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  byte *local_38;
  uchar *p;
  size_t list_size;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  p = (uchar *)(ulong)*buf;
  if (p + 1 == (uchar *)len) {
    local_38 = buf + 1;
    for (; p != (uchar *)0x0; p = p + -1) {
      if ((*local_38 == 0) || (*local_38 == 1)) {
        (ssl->handshake->ecdh_ctx).point_format = (uint)*local_38;
        mbedtls_debug_print_msg
                  (ssl,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0x13b,"point format selected: %d",(ulong)*local_38);
        return 0;
      }
      local_38 = local_38 + 1;
    }
    ssl_local._4_4_ = 0;
  }
  else {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,299,"bad client hello message");
    ssl_local._4_4_ = -0x7900;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_supported_point_formats( mbedtls_ssl_context *ssl,
                                              const unsigned char *buf,
                                              size_t len )
{
    size_t list_size;
    const unsigned char *p;

    list_size = buf[0];
    if( list_size + 1 != len )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
    }

    p = buf + 1;
    while( list_size > 0 )
    {
        if( p[0] == MBEDTLS_ECP_PF_UNCOMPRESSED ||
            p[0] == MBEDTLS_ECP_PF_COMPRESSED )
        {
#if defined(MBEDTLS_ECDH_C) || defined(MBEDTLS_ECDSA_C)
            ssl->handshake->ecdh_ctx.point_format = p[0];
#endif
#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
            ssl->handshake->ecjpake_ctx.point_format = p[0];
#endif
            MBEDTLS_SSL_DEBUG_MSG( 4, ( "point format selected: %d", p[0] ) );
            return( 0 );
        }

        list_size--;
        p++;
    }

    return( 0 );
}